

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

void __thiscall
ncnn::Yolov3DetectionOutput::nms_sorted_bboxes
          (Yolov3DetectionOutput *this,
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          *bboxes,vector<unsigned_long,_std::allocator<unsigned_long>_> *picked,float nms_threshold)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  BBoxRect *in_RSI;
  float in_XMM0_Da;
  float union_area;
  float inter_area;
  BBoxRect *b;
  int j;
  int keep;
  BBoxRect *a;
  size_t i;
  size_t n;
  BBoxRect *b_00;
  undefined4 in_stack_ffffffffffffffa8;
  int iVar7;
  float in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  int local_40;
  ulong local_30;
  
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::clear
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16aa913);
  sVar2 = std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
          ::size((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                  *)in_RSI);
  local_30 = 0;
  do {
    if (sVar2 <= local_30) {
      return;
    }
    pvVar3 = std::
             vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
             ::operator[]((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                           *)in_RSI,local_30);
    bVar1 = true;
    local_40 = 0;
    while( true ) {
      iVar7 = local_40;
      sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
      if ((int)sVar4 <= iVar7) break;
      b_00 = in_RSI;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,(long)local_40);
      pvVar6 = std::
               vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
               ::operator[]((vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                             *)b_00,*pvVar5);
      in_stack_ffffffffffffffb4 =
           intersection_area((BBoxRect *)CONCAT44(iVar7,in_stack_ffffffffffffffa8),b_00);
      in_stack_ffffffffffffffb0 = (pvVar3->area + pvVar6->area) - in_stack_ffffffffffffffb4;
      if (in_XMM0_Da * in_stack_ffffffffffffffb0 < in_stack_ffffffffffffffb4) {
        bVar1 = false;
        break;
      }
      local_40 = local_40 + 1;
    }
    if (bVar1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (value_type_conflict5 *)CONCAT44(iVar7,in_stack_ffffffffffffffa8));
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Yolov3DetectionOutput::nms_sorted_bboxes(std::vector<BBoxRect>& bboxes, std::vector<size_t>& picked, float nms_threshold) const
{
    picked.clear();

    const size_t n = bboxes.size();

    for (size_t i = 0; i < n; i++)
    {
        const BBoxRect& a = bboxes[i];

        int keep = 1;
        for (int j = 0; j < (int)picked.size(); j++)
        {
            const BBoxRect& b = bboxes[picked[j]];

            // intersection over union
            float inter_area = intersection_area(a, b);
            float union_area = a.area + b.area - inter_area;
            // float IoU = inter_area / union_area
            if (inter_area > nms_threshold * union_area)
            {
                keep = 0;
                break;
            }
        }

        if (keep)
            picked.push_back(i);
    }
}